

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffcrhd(fitsfile *fptr,int *status)

{
  int *piVar1;
  FITSfile *pFVar2;
  LONGLONG bytepos;
  int iVar3;
  LONGLONG *pLVar4;
  int tstatus;
  int local_1c;
  
  local_1c = 0;
  iVar3 = *status;
  if (iVar3 < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar2 = fptr->Fptr;
    if (pFVar2->headend != pFVar2->headstart[pFVar2->curhdu]) {
      if (local_1c < 1) {
        do {
          ffmahd(fptr,fptr->HDUposition + 2,(int *)0x0,&local_1c);
        } while (local_1c == 0);
      }
      pFVar2 = fptr->Fptr;
      if (pFVar2->maxhdu == pFVar2->MAXHDU) {
        pLVar4 = (LONGLONG *)realloc(pFVar2->headstart,(long)pFVar2->MAXHDU * 8 + 0x1f48);
        if (pLVar4 == (LONGLONG *)0x0) {
          *status = 0x71;
          return 0x71;
        }
        pFVar2 = fptr->Fptr;
        piVar1 = &pFVar2->MAXHDU;
        *piVar1 = *piVar1 + 1000;
        pFVar2->headstart = pLVar4;
      }
      iVar3 = ffchdu(fptr,status);
      if (iVar3 < 1) {
        bytepos = fptr->Fptr->headstart[(long)fptr->Fptr->maxhdu + 1];
        ffmbyt(fptr,bytepos,1,status);
        pFVar2 = fptr->Fptr;
        iVar3 = pFVar2->maxhdu + 1;
        pFVar2->maxhdu = iVar3;
        pFVar2->curhdu = iVar3;
        fptr->HDUposition = iVar3;
        pFVar2->nextkey = bytepos;
        pFVar2->headend = bytepos;
        pFVar2->datastart = -1;
        pFVar2->dither_seed = pFVar2->request_dither_seed;
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffcrhd(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  CReate Header Data unit:  Create, initialize, and move the i/o pointer
  to a new extension appended to the end of the FITS file.
*/
{
    int  tstatus = 0;
    LONGLONG bytepos, *ptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* If the current header is empty, we don't have to do anything */
    if ((fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status);

    while (ffmrhd(fptr, 1, 0, &tstatus) == 0);  /* move to end of file */

    if ((fptr->Fptr)->maxhdu == (fptr->Fptr)->MAXHDU)
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        ((fptr->Fptr)->MAXHDU + 1001) * sizeof(LONGLONG) );

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = (fptr->Fptr)->MAXHDU + 1000;
          (fptr->Fptr)->headstart = ptr;
        }
    }

    if (ffchdu(fptr, status) <= 0)  /* close the current HDU */
    {
      bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1]; /* last */
      ffmbyt(fptr, bytepos, IGNORE_EOF, status);  /* move file ptr to it */
      (fptr->Fptr)->maxhdu++;       /* increment the known number of HDUs */
      (fptr->Fptr)->curhdu = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      fptr->HDUposition    = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      (fptr->Fptr)->nextkey = bytepos;    /* next keyword = start of header */
      (fptr->Fptr)->headend = bytepos;          /* end of header */
      (fptr->Fptr)->datastart = DATA_UNDEFINED; /* start data unit undefined */

       /* any other needed resets */
       
       /* reset the dithering offset that may have been calculated for the */
       /* previous HDU back to the requested default value */
       (fptr->Fptr)->dither_seed = (fptr->Fptr)->request_dither_seed;
    }

    return(*status);
}